

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O2

void P_DrawSplash2(int count,DVector3 *pos,DAngle *angle,int updown,int kind)

{
  double dVar1;
  uint32 uVar2;
  int iVar3;
  uint32 uVar4;
  uint uVar5;
  particle_t *ppVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  uint32 local_5c;
  
  if (kind == 2) {
    local_5c = grey3;
    uVar2 = grey1;
  }
  else if (kind == 1) {
    local_5c = grey3;
    uVar2 = grey5;
  }
  else if (kind == 0) {
    local_5c = blood1;
    uVar2 = blood2;
  }
  else {
    local_5c = ParticleColor(kind);
    uVar2 = ParticleColor((uint)(byte)((ushort)((kind & 0xff00ffU) >> 0x10) / 3),
                          (uint)(byte)(((ushort)((uint)kind >> 8) & 0xff) / 3),
                          (uint)(byte)((ushort)(kind & 0xff00ffU) / 3));
  }
  dVar1 = *(double *)(&DAT_00694a00 + (ulong)(updown == 0) * 8);
  while( true ) {
    bVar7 = count == 0;
    count = count + -1;
    if (bVar7) {
      return;
    }
    ppVar6 = NewParticle();
    if (ppVar6 == (particle_t *)0x0) break;
    ppVar6->ttl = '\f';
    ppVar6->trans = 0xff;
    ppVar6->fade = '\x15';
    ppVar6->size = 4.0;
    iVar3 = FRandom::operator()(&M_Random);
    uVar4 = local_5c;
    if (-1 < (char)iVar3) {
      uVar4 = uVar2;
    }
    ppVar6->color = uVar4;
    iVar3 = FRandom::operator()(&M_Random);
    (ppVar6->Vel).Z = (double)iVar3 * -0.001953125;
    (ppVar6->Acc).Z = -0.045454545454545456;
    if (kind != 0) {
      iVar3 = FRandom::operator()(&M_Random);
      dVar8 = (double)(iVar3 + -0x80) * 0.703125 + angle->Degrees;
      iVar3 = FRandom::operator()(&M_Random);
      dVar9 = fastcosdeg(dVar8);
      (ppVar6->Vel).X = dVar9 * (double)iVar3 * 0.00048828125;
      iVar3 = FRandom::operator()(&M_Random);
      dVar8 = fastsindeg(dVar8);
      dVar8 = dVar8 * (double)iVar3 * 0.00048828125;
      (ppVar6->Vel).Y = dVar8;
      (ppVar6->Acc).X = (ppVar6->Vel).X * 0.0625;
      (ppVar6->Acc).Y = dVar8 * 0.0625;
    }
    iVar3 = FRandom::operator()(&M_Random);
    dVar9 = (double)(iVar3 + -0x80) * 0.3515625 + angle->Degrees;
    dVar8 = pos->X;
    uVar5 = FRandom::operator()(&M_Random);
    dVar10 = fastcosdeg(dVar9);
    (ppVar6->Pos).X = dVar10 * (double)(int)((uVar5 & 0x1f) - 0xf) + dVar8;
    dVar8 = pos->Y;
    uVar5 = FRandom::operator()(&M_Random);
    dVar9 = fastsindeg(dVar9);
    (ppVar6->Pos).Y = dVar9 * (double)(int)((uVar5 & 0x1f) - 0xf) + dVar8;
    dVar8 = pos->Z;
    iVar3 = FRandom::operator()(&M_Random);
    (ppVar6->Pos).Z = (double)(int)(iVar3 + (updown != 2 | 0xfffffffe) * 0x80) * dVar1 + dVar8;
  }
  return;
}

Assistant:

void P_DrawSplash2 (int count, const DVector3 &pos, DAngle angle, int updown, int kind)
{
	int color1, color2, zadd;
	double zvel, zspread;

	switch (kind)
	{
	case 0:		// Blood
		color1 = blood1;
		color2 = blood2;
		break;
	case 1:		// Gunshot
		color1 = grey3;
		color2 = grey5;
		break;
	case 2:		// Smoke
		color1 = grey3;
		color2 = grey1;
		break;
	default:	// colorized blood
		color1 = ParticleColor(kind);
		color2 = ParticleColor(RPART(kind)/3, GPART(kind)/3, BPART(kind)/3);
		break;
	}

	zvel = -1./512.;
	zspread = updown ? -6000 / 65536. : 6000 / 65536.;
	zadd = (updown == 2) ? -128 : 0;

	for (; count; count--)
	{
		particle_t *p = NewParticle ();
		DAngle an;

		if (!p)
			break;

		p->ttl = 12;
		p->fade = FADEFROMTTL(12);
		p->trans = 255;
		p->size = 4;
		p->color = M_Random() & 0x80 ? color1 : color2;
		p->Vel.Z = M_Random() * zvel;
		p->Acc.Z = -1 / 22.;
		if (kind) 
		{
			an = angle + ((M_Random() - 128) * (180 / 256.));
			p->Vel.X = M_Random() * an.Cos() / 2048.;
			p->Vel.Y = M_Random() * an.Sin() / 2048.;
			p->Acc.X = p->Vel.X / 16.;
			p->Acc.Y = p->Vel.Y / 16.;
		}
		an = angle + ((M_Random() - 128) * (90 / 256.));
		p->Pos.X = pos.X + ((M_Random() & 31) - 15) * an.Cos();
		p->Pos.Y = pos.Y + ((M_Random() & 31) - 15) * an.Sin();
		p->Pos.Z = pos.Z + (M_Random() + zadd - 128) * zspread;
	}
}